

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string.hpp
# Opt level: O1

string * __thiscall shine::string::format_append(string *this,int8 *fmt,...)

{
  char in_AL;
  int iVar1;
  undefined8 in_RCX;
  undefined8 in_RDX;
  undefined8 in_R8;
  undefined8 in_R9;
  undefined8 in_XMM0_Qa;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM3_Qa;
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM5_Qa;
  undefined8 in_XMM6_Qa;
  undefined8 in_XMM7_Qa;
  string tmp;
  va_list args;
  char *local_128;
  size_t local_120;
  char local_118 [16];
  undefined8 local_108;
  size_type *local_100;
  undefined1 *local_f8;
  undefined1 local_e8 [16];
  undefined8 local_d8;
  undefined8 local_d0;
  undefined8 local_c8;
  undefined8 local_c0;
  undefined8 local_b8;
  undefined8 local_a8;
  undefined8 local_98;
  undefined8 local_88;
  undefined8 local_78;
  undefined8 local_68;
  undefined8 local_58;
  undefined8 local_48;
  
  if (in_AL != '\0') {
    local_b8 = in_XMM0_Qa;
    local_a8 = in_XMM1_Qa;
    local_98 = in_XMM2_Qa;
    local_88 = in_XMM3_Qa;
    local_78 = in_XMM4_Qa;
    local_68 = in_XMM5_Qa;
    local_58 = in_XMM6_Qa;
    local_48 = in_XMM7_Qa;
  }
  local_128 = local_118;
  local_120 = 0;
  local_118[0] = '\0';
  local_100 = &tmp.super_string._M_string_length;
  local_108 = 0x3000000010;
  local_f8 = local_e8;
  local_d8 = in_RDX;
  local_d0 = in_RCX;
  local_c8 = in_R8;
  local_c0 = in_R9;
  iVar1 = vsnprintf((char *)0x0,0,fmt,&local_108);
  local_108 = 0x3000000010;
  local_100 = &tmp.super_string._M_string_length;
  local_f8 = local_e8;
  std::__cxx11::string::resize((ulong)&local_128,(char)iVar1 + '\x01');
  vsnprintf(local_128,local_120,fmt,&local_108);
  std::__cxx11::string::resize((ulong)&local_128,(char)iVar1);
  std::__cxx11::string::_M_append((char *)this,(ulong)local_128);
  if (local_128 != local_118) {
    operator_delete(local_128);
  }
  return this;
}

Assistant:

string& format_append(const int8 *fmt, ...){
            string tmp;
            va_list args;
                    va_start(args, fmt);
            size_type size = assert_size(fmt, args);
                    va_end(args);

                    va_start(args, fmt);
            tmp.resize(size + 1);
            format(tmp, fmt, args);
                    va_end(args);
            tmp.resize(size);

            append(tmp);
            return *this;

        }